

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrtrns.cpp
# Opt level: O3

UChar * u_strFromUTF32WithSub_63
                  (UChar *dest,int32_t destCapacity,int32_t *pDestLength,UChar32 *src,
                  int32_t srcLength,UChar32 subchar,int32_t *pNumSubstitutions,
                  UErrorCode *pErrorCode)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  UChar *pUVar4;
  UChar *pUVar5;
  UChar *pUVar6;
  uint uVar7;
  uint *puVar8;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return (UChar *)0x0;
  }
  if ((((destCapacity < 0) || (srcLength < -1)) || (src == (UChar32 *)0x0 && srcLength != 0)) ||
     ((0x10ffff < subchar || destCapacity != 0 && dest == (UChar *)0x0) ||
      (subchar & 0xfffff800U) == 0xd800)) {
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return (UChar *)0x0;
  }
  if (pNumSubstitutions != (int32_t *)0x0) {
    *pNumSubstitutions = 0;
  }
  pUVar6 = dest + (uint)destCapacity;
  if (dest == (UChar *)0x0) {
    pUVar6 = (UChar *)0x0;
  }
  pUVar5 = dest;
  if (-1 < srcLength) {
    puVar8 = (uint *)(src + (uint)srcLength);
    if (src == (UChar32 *)0x0) {
      puVar8 = (uint *)0x0;
    }
    iVar3 = 0;
    goto LAB_002efe15;
  }
  iVar3 = 0;
  uVar7 = *src;
  while (uVar7 != 0) {
    puVar8 = (uint *)src;
    if ((uVar7 & 0xffffe000) != 0xe000 && 0xd7ff < uVar7) goto LAB_002eff81;
    if (pUVar5 < pUVar6) {
      *pUVar5 = (UChar)uVar7;
      pUVar5 = pUVar5 + 1;
    }
    else {
      iVar3 = iVar3 + 1;
    }
    src = (UChar32 *)((uint *)src + 1);
    uVar7 = *src;
  }
LAB_002eff44:
  iVar2 = 0;
LAB_002eff46:
  iVar3 = (int)((ulong)((long)pUVar5 - (long)dest) >> 1) + iVar3;
  if (pDestLength != (int32_t *)0x0) {
    *pDestLength = iVar3;
  }
  if (pNumSubstitutions != (int32_t *)0x0) {
    *pNumSubstitutions = iVar2;
  }
  u_terminateUChars_63(dest,destCapacity,iVar3,pErrorCode);
  return dest;
LAB_002eff81:
  do {
    puVar1 = puVar8 + 1;
    puVar8 = puVar8 + 1;
  } while (*puVar1 != 0);
LAB_002efe15:
  if (src < puVar8) {
    iVar2 = 0;
    pUVar4 = pUVar5;
    do {
      uVar7 = *src;
      if ((uVar7 & 0xffffe000) != 0xe000 && 0xd7ff < uVar7) {
        do {
          if (uVar7 - 0x10000 < 0x100000) {
            pUVar5 = pUVar4 + 2;
            if (pUVar6 < pUVar5 || pUVar4 == (UChar *)0x0) {
              iVar3 = iVar3 + 2;
              pUVar5 = pUVar4;
            }
            else {
              *pUVar4 = (short)(uVar7 >> 10) + L'ퟀ';
              pUVar4[1] = (ushort)uVar7 & 0x3ff | 0xdc00;
            }
            goto LAB_002efeeb;
          }
          if (subchar < 0) {
            *pErrorCode = U_INVALID_CHAR_FOUND;
            return (UChar *)0x0;
          }
          iVar2 = iVar2 + 1;
          uVar7 = subchar;
        } while ((subchar & 0xffffe000U) != 0xe000 && 0xd7ff < (uint)subchar);
      }
      if (pUVar4 < pUVar6) {
        *pUVar4 = (UChar)uVar7;
        pUVar5 = pUVar4 + 1;
      }
      else {
        iVar3 = iVar3 + 1;
        pUVar5 = pUVar4;
      }
LAB_002efeeb:
      src = (UChar32 *)((uint *)src + 1);
      pUVar4 = pUVar5;
    } while (src < puVar8);
    goto LAB_002eff46;
  }
  goto LAB_002eff44;
}

Assistant:

U_CAPI UChar* U_EXPORT2 
u_strFromUTF32WithSub(UChar *dest,
               int32_t destCapacity,
               int32_t *pDestLength,
               const UChar32 *src,
               int32_t srcLength,
               UChar32 subchar, int32_t *pNumSubstitutions,
               UErrorCode *pErrorCode) {
    const UChar32 *srcLimit;
    UChar32 ch;
    UChar *destLimit;
    UChar *pDest;
    int32_t reqLength;
    int32_t numSubstitutions;

    /* args check */
    if(U_FAILURE(*pErrorCode)){
        return NULL;
    }
    if( (src==NULL && srcLength!=0) || srcLength < -1 ||
        (destCapacity<0) || (dest == NULL && destCapacity > 0) ||
        subchar > 0x10ffff || U_IS_SURROGATE(subchar)
    ) {
        *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return NULL;
    }

    if(pNumSubstitutions != NULL) {
        *pNumSubstitutions = 0;
    }

    pDest = dest;
    destLimit = (dest!=NULL)?(dest + destCapacity):NULL;
    reqLength = 0;
    numSubstitutions = 0;

    if(srcLength < 0) {
        /* simple loop for conversion of a NUL-terminated BMP string */
        while((ch=*src) != 0 &&
              ((uint32_t)ch < 0xd800 || (0xe000 <= ch && ch <= 0xffff))) {
            ++src;
            if(pDest < destLimit) {
                *pDest++ = (UChar)ch;
            } else {
                ++reqLength;
            }
        }
        srcLimit = src;
        if(ch != 0) {
            /* "complicated" case, find the end of the remaining string */
            while(*++srcLimit != 0) {}
        }
    } else {
      srcLimit = (src!=NULL)?(src + srcLength):NULL;
    }

    /* convert with length */
    while(src < srcLimit) {
        ch = *src++;
        do {
            /* usually "loops" once; twice only for writing subchar */
            if((uint32_t)ch < 0xd800 || (0xe000 <= ch && ch <= 0xffff)) {
                if(pDest < destLimit) {
                    *pDest++ = (UChar)ch;
                } else {
                    ++reqLength;
                }
                break;
            } else if(0x10000 <= ch && ch <= 0x10ffff) {
                if(pDest!=NULL && ((pDest + 2) <= destLimit)) {
                    *pDest++ = U16_LEAD(ch);
                    *pDest++ = U16_TRAIL(ch);
                } else {
                    reqLength += 2;
                }
                break;
            } else if((ch = subchar) < 0) {
                /* surrogate code point, or not a Unicode code point at all */
                *pErrorCode = U_INVALID_CHAR_FOUND;
                return NULL;
            } else {
                ++numSubstitutions;
            }
        } while(TRUE);
    }

    reqLength += (int32_t)(pDest - dest);
    if(pDestLength) {
        *pDestLength = reqLength;
    }
    if(pNumSubstitutions != NULL) {
        *pNumSubstitutions = numSubstitutions;
    }

    /* Terminate the buffer */
    u_terminateUChars(dest, destCapacity, reqLength, pErrorCode);
    
    return dest;
}